

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O0

Availability __thiscall
TapSatisfier::Sign(TapSatisfier *this,XOnlyPubKey *key,
                  vector<unsigned_char,_std::allocator<unsigned_char>_> *sig)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  uint256 *in_stack_00000070;
  XOnlyPubKey *in_stack_00000078;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000080;
  SigningProvider *in_stack_00000088;
  SignatureData *in_stack_00000090;
  BaseSignatureCreator *in_stack_00000098;
  SigVersion in_stack_00000200;
  Availability local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CreateTaprootScriptSig
                    (in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080,
                     in_stack_00000078,in_stack_00000070,in_stack_00000200);
  local_c = (Availability)bVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

miniscript::Availability Sign(const XOnlyPubKey& key, std::vector<unsigned char>& sig) const {
        if (CreateTaprootScriptSig(m_creator, m_sig_data, m_provider, sig, key, m_leaf_hash, SigVersion::TAPSCRIPT)) {
            return miniscript::Availability::YES;
        }
        return miniscript::Availability::NO;
    }